

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ec_pubkey_parse
              (secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *input,size_t inputlen)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  int iVar143;
  ulong uVar144;
  ulong uVar145;
  ulong uVar146;
  ulong uVar147;
  ulong uVar148;
  ulong uVar149;
  ulong uVar150;
  ulong uVar151;
  ulong uVar152;
  ulong uVar153;
  ulong uVar154;
  ulong uVar155;
  ulong uVar156;
  secp256k1_fe x_1;
  secp256k1_fe x;
  secp256k1_ge local_108;
  secp256k1_fe local_a8;
  secp256k1_fe local_80;
  secp256k1_fe local_58;
  
  if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_ec_pubkey_parse_cold_2();
  }
  else {
    pubkey->data[0x30] = '\0';
    pubkey->data[0x31] = '\0';
    pubkey->data[0x32] = '\0';
    pubkey->data[0x33] = '\0';
    pubkey->data[0x34] = '\0';
    pubkey->data[0x35] = '\0';
    pubkey->data[0x36] = '\0';
    pubkey->data[0x37] = '\0';
    pubkey->data[0x38] = '\0';
    pubkey->data[0x39] = '\0';
    pubkey->data[0x3a] = '\0';
    pubkey->data[0x3b] = '\0';
    pubkey->data[0x3c] = '\0';
    pubkey->data[0x3d] = '\0';
    pubkey->data[0x3e] = '\0';
    pubkey->data[0x3f] = '\0';
    pubkey->data[0x20] = '\0';
    pubkey->data[0x21] = '\0';
    pubkey->data[0x22] = '\0';
    pubkey->data[0x23] = '\0';
    pubkey->data[0x24] = '\0';
    pubkey->data[0x25] = '\0';
    pubkey->data[0x26] = '\0';
    pubkey->data[0x27] = '\0';
    pubkey->data[0x28] = '\0';
    pubkey->data[0x29] = '\0';
    pubkey->data[0x2a] = '\0';
    pubkey->data[0x2b] = '\0';
    pubkey->data[0x2c] = '\0';
    pubkey->data[0x2d] = '\0';
    pubkey->data[0x2e] = '\0';
    pubkey->data[0x2f] = '\0';
    pubkey->data[0x10] = '\0';
    pubkey->data[0x11] = '\0';
    pubkey->data[0x12] = '\0';
    pubkey->data[0x13] = '\0';
    pubkey->data[0x14] = '\0';
    pubkey->data[0x15] = '\0';
    pubkey->data[0x16] = '\0';
    pubkey->data[0x17] = '\0';
    pubkey->data[0x18] = '\0';
    pubkey->data[0x19] = '\0';
    pubkey->data[0x1a] = '\0';
    pubkey->data[0x1b] = '\0';
    pubkey->data[0x1c] = '\0';
    pubkey->data[0x1d] = '\0';
    pubkey->data[0x1e] = '\0';
    pubkey->data[0x1f] = '\0';
    pubkey->data[0] = '\0';
    pubkey->data[1] = '\0';
    pubkey->data[2] = '\0';
    pubkey->data[3] = '\0';
    pubkey->data[4] = '\0';
    pubkey->data[5] = '\0';
    pubkey->data[6] = '\0';
    pubkey->data[7] = '\0';
    pubkey->data[8] = '\0';
    pubkey->data[9] = '\0';
    pubkey->data[10] = '\0';
    pubkey->data[0xb] = '\0';
    pubkey->data[0xc] = '\0';
    pubkey->data[0xd] = '\0';
    pubkey->data[0xe] = '\0';
    pubkey->data[0xf] = '\0';
    if (input != (uchar *)0x0) {
      if (inputlen == 0x41) {
        bVar1 = *input;
        if (7 < bVar1) {
          return 0;
        }
        if ((0xd0U >> (bVar1 & 0x1f) & 1) == 0) {
          return 0;
        }
        secp256k1_fe_impl_set_b32_mod(&local_80,input + 1);
        iVar143 = 0;
        if ((((local_80.n[0] < 0xffffefffffc2f) || (local_80.n[4] != 0xffffffffffff)) ||
            ((local_80.n[2] & local_80.n[3] & local_80.n[1]) != 0xfffffffffffff)) &&
           (((secp256k1_fe_impl_set_b32_mod(&local_a8,input + 0x21), local_a8.n[0] < 0xffffefffffc2f
             || (local_a8.n[4] != 0xffffffffffff)) ||
            ((local_a8.n[2] & local_a8.n[3] & local_a8.n[1]) != 0xfffffffffffff)))) {
          local_108.infinity = 0;
          local_108.x.n[0] = local_80.n[0];
          local_108.x.n[1] = local_80.n[1];
          local_108.x.n[2] = local_80.n[2];
          local_108.x.n[3] = local_80.n[3];
          local_108.x.n[4] = local_80.n[4];
          local_108.y.n[0] = local_a8.n[0];
          local_108.y.n[1] = local_a8.n[1];
          local_108.y.n[2] = local_a8.n[2];
          local_108.y.n[3] = local_a8.n[3];
          local_108.y.n[4] = local_a8.n[4];
          if (((bVar1 & 0xfe) == 6 & (bVar1 != 7 ^ (byte)local_a8.n[0] ^ 1)) == 0) {
            uVar146 = local_a8.n[0] * 2;
            auVar2._8_8_ = 0;
            auVar2._0_8_ = local_a8.n[3];
            auVar75._8_8_ = 0;
            auVar75._0_8_ = uVar146;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_a8.n[2];
            auVar76._8_8_ = 0;
            auVar76._0_8_ = local_a8.n[1] * 2;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = local_a8.n[4];
            auVar77._8_8_ = 0;
            auVar77._0_8_ = local_a8.n[4];
            auVar5._8_8_ = 0;
            auVar5._0_8_ = SUB168(auVar4 * auVar77,0);
            auVar5 = auVar3 * auVar76 + auVar2 * auVar75 + auVar5 * ZEXT816(0x1000003d10);
            uVar145 = local_a8.n[4] * 2;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = uVar145;
            auVar78._8_8_ = 0;
            auVar78._0_8_ = local_a8.n[0];
            auVar7._8_8_ = 0;
            auVar7._0_8_ = local_a8.n[3];
            auVar79._8_8_ = 0;
            auVar79._0_8_ = local_a8.n[1] * 2;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = local_a8.n[2];
            auVar80._8_8_ = 0;
            auVar80._0_8_ = local_a8.n[2];
            auVar9._8_8_ = 0;
            auVar9._0_8_ = SUB168(auVar4 * auVar77,8);
            auVar2 = auVar9 * ZEXT816(0x1000003d10000) +
                     auVar6 * auVar78 + auVar8 * auVar80 + auVar7 * auVar79 + (auVar5 >> 0x34);
            auVar10._8_8_ = 0;
            auVar10._0_8_ = local_a8.n[0];
            auVar81._8_8_ = 0;
            auVar81._0_8_ = local_a8.n[0];
            auVar11._8_8_ = 0;
            auVar11._0_8_ = uVar145;
            auVar82._8_8_ = 0;
            auVar82._0_8_ = local_a8.n[1];
            auVar12._8_8_ = 0;
            auVar12._0_8_ = local_a8.n[3];
            auVar83._8_8_ = 0;
            auVar83._0_8_ = local_a8.n[2] * 2;
            auVar3 = auVar12 * auVar83 + auVar11 * auVar82 + (auVar2 >> 0x34);
            auVar13._8_8_ = 0;
            auVar13._0_8_ = (auVar3._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar2._6_2_ & 0xf);
            auVar4 = auVar10 * auVar81 + auVar13 * ZEXT816(0x1000003d1);
            uVar144 = auVar4._0_8_;
            uVar153 = auVar4._8_8_;
            auVar140._8_8_ = uVar153 >> 0x34;
            auVar140._0_8_ = uVar153 * 0x1000 | uVar144 >> 0x34;
            auVar14._8_8_ = 0;
            auVar14._0_8_ = local_a8.n[1];
            auVar84._8_8_ = 0;
            auVar84._0_8_ = uVar146;
            auVar15._8_8_ = 0;
            auVar15._0_8_ = uVar145;
            auVar85._8_8_ = 0;
            auVar85._0_8_ = local_a8.n[2];
            auVar16._8_8_ = 0;
            auVar16._0_8_ = local_a8.n[3];
            auVar86._8_8_ = 0;
            auVar86._0_8_ = local_a8.n[3];
            auVar3 = auVar16 * auVar86 + auVar15 * auVar85 + (auVar3 >> 0x34);
            auVar17._8_8_ = 0;
            auVar17._0_8_ = auVar3._0_8_ & 0xfffffffffffff;
            auVar140 = auVar14 * auVar84 + auVar17 * ZEXT816(0x1000003d10) + auVar140;
            uVar153 = auVar140._0_8_;
            uVar150 = auVar140._8_8_;
            auVar130._8_8_ = uVar150 >> 0x34;
            auVar130._0_8_ = uVar150 * 0x1000 | uVar153 >> 0x34;
            auVar18._8_8_ = 0;
            auVar18._0_8_ = local_a8.n[2];
            auVar87._8_8_ = 0;
            auVar87._0_8_ = uVar146;
            auVar19._8_8_ = 0;
            auVar19._0_8_ = local_a8.n[1];
            auVar88._8_8_ = 0;
            auVar88._0_8_ = local_a8.n[1];
            auVar20._8_8_ = 0;
            auVar20._0_8_ = uVar145;
            auVar89._8_8_ = 0;
            auVar89._0_8_ = local_a8.n[3];
            auVar3 = auVar20 * auVar89 + (auVar3 >> 0x34);
            auVar21._8_8_ = 0;
            auVar21._0_8_ = auVar3._0_8_;
            auVar130 = auVar21 * ZEXT816(0x1000003d10) + auVar19 * auVar88 + auVar18 * auVar87 +
                       auVar130;
            auVar4 = auVar130 >> 0x34;
            auVar134._8_8_ = 0;
            auVar134._0_8_ = auVar4._0_8_;
            auVar22._8_8_ = 0;
            auVar22._0_8_ = auVar3._8_8_;
            auVar133._8_8_ = auVar4._8_8_;
            auVar133._0_8_ = auVar5._0_8_ & 0xffffffffffffe;
            auVar134 = auVar22 * ZEXT816(0x1000003d10000) + auVar133 + auVar134;
            uVar147 = auVar134._0_8_;
            uVar145 = local_80.n[0] * 2;
            auVar23._8_8_ = 0;
            auVar23._0_8_ = local_80.n[3];
            auVar90._8_8_ = 0;
            auVar90._0_8_ = uVar145;
            auVar24._8_8_ = 0;
            auVar24._0_8_ = local_80.n[2];
            auVar91._8_8_ = 0;
            auVar91._0_8_ = local_80.n[1] * 2;
            auVar25._8_8_ = 0;
            auVar25._0_8_ = local_80.n[4];
            auVar92._8_8_ = 0;
            auVar92._0_8_ = local_80.n[4];
            auVar26._8_8_ = 0;
            auVar26._0_8_ = SUB168(auVar25 * auVar92,0);
            auVar3 = auVar26 * ZEXT816(0x1000003d10) + auVar24 * auVar91 + auVar23 * auVar90;
            uVar146 = local_80.n[4] * 2;
            auVar27._8_8_ = 0;
            auVar27._0_8_ = uVar146;
            auVar93._8_8_ = 0;
            auVar93._0_8_ = local_80.n[0];
            auVar28._8_8_ = 0;
            auVar28._0_8_ = local_80.n[3];
            auVar94._8_8_ = 0;
            auVar94._0_8_ = local_80.n[1] * 2;
            auVar29._8_8_ = 0;
            auVar29._0_8_ = local_80.n[2];
            auVar95._8_8_ = 0;
            auVar95._0_8_ = local_80.n[2];
            auVar30._8_8_ = 0;
            auVar30._0_8_ = SUB168(auVar25 * auVar92,8);
            auVar5 = auVar30 * ZEXT816(0x1000003d10000) +
                     auVar27 * auVar93 + auVar29 * auVar95 + auVar28 * auVar94 + (auVar3 >> 0x34);
            auVar31._8_8_ = 0;
            auVar31._0_8_ = local_80.n[0];
            auVar96._8_8_ = 0;
            auVar96._0_8_ = local_80.n[0];
            auVar32._8_8_ = 0;
            auVar32._0_8_ = uVar146;
            auVar97._8_8_ = 0;
            auVar97._0_8_ = local_80.n[1];
            auVar33._8_8_ = 0;
            auVar33._0_8_ = local_80.n[3];
            auVar98._8_8_ = 0;
            auVar98._0_8_ = local_80.n[2] * 2;
            auVar4 = auVar33 * auVar98 + auVar32 * auVar97 + (auVar5 >> 0x34);
            auVar34._8_8_ = 0;
            auVar34._0_8_ = (auVar4._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar5._6_2_ & 0xf);
            auVar6 = auVar31 * auVar96 + auVar34 * ZEXT816(0x1000003d1);
            uVar150 = auVar6._0_8_;
            uVar151 = auVar6._8_8_;
            auVar35._8_8_ = 0;
            auVar35._0_8_ = local_80.n[1];
            auVar99._8_8_ = 0;
            auVar99._0_8_ = uVar145;
            auVar36._8_8_ = 0;
            auVar36._0_8_ = uVar146;
            auVar100._8_8_ = 0;
            auVar100._0_8_ = local_80.n[2];
            auVar141._8_8_ = uVar151 >> 0x34;
            auVar141._0_8_ = uVar151 * 0x1000 | uVar150 >> 0x34;
            auVar37._8_8_ = 0;
            auVar37._0_8_ = local_80.n[3];
            auVar101._8_8_ = 0;
            auVar101._0_8_ = local_80.n[3];
            auVar4 = auVar37 * auVar101 + auVar36 * auVar100 + (auVar4 >> 0x34);
            auVar38._8_8_ = 0;
            auVar38._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
            auVar141 = auVar35 * auVar99 + auVar38 * ZEXT816(0x1000003d10) + auVar141;
            uVar151 = auVar141._0_8_;
            uVar148 = auVar141._8_8_;
            auVar39._8_8_ = 0;
            auVar39._0_8_ = local_80.n[2];
            auVar102._8_8_ = 0;
            auVar102._0_8_ = uVar145;
            auVar135._8_8_ = uVar148 >> 0x34;
            auVar135._0_8_ = uVar148 * 0x1000 | uVar151 >> 0x34;
            auVar40._8_8_ = 0;
            auVar40._0_8_ = local_80.n[1];
            auVar103._8_8_ = 0;
            auVar103._0_8_ = local_80.n[1];
            auVar41._8_8_ = 0;
            auVar41._0_8_ = uVar146;
            auVar104._8_8_ = 0;
            auVar104._0_8_ = local_80.n[3];
            auVar4 = auVar41 * auVar104 + (auVar4 >> 0x34);
            auVar42._8_8_ = 0;
            auVar42._0_8_ = auVar4._0_8_;
            auVar135 = auVar42 * ZEXT816(0x1000003d10) + auVar40 * auVar103 + auVar39 * auVar102 +
                       auVar135;
            auVar6 = auVar135 >> 0x34;
            auVar136._8_8_ = auVar6._8_8_;
            auVar136._0_8_ = auVar3._0_8_ & 0xffffffffffffe;
            auVar137._8_8_ = 0;
            auVar137._0_8_ = auVar6._0_8_;
            auVar43._8_8_ = 0;
            auVar43._0_8_ = auVar4._8_8_;
            auVar137 = auVar43 * ZEXT816(0x1000003d10000) + auVar136 + auVar137;
            uVar152 = auVar137._0_8_;
            uVar150 = uVar150 & 0xfffffffffffff;
            auVar44._8_8_ = 0;
            auVar44._0_8_ = uVar150;
            auVar105._8_8_ = 0;
            auVar105._0_8_ = local_80.n[3];
            uVar149 = (auVar137._8_8_ << 0xc | uVar152 >> 0x34) + (auVar5._0_8_ & 0xffffffffffff);
            uVar151 = uVar151 & 0xfffffffffffff;
            auVar45._8_8_ = 0;
            auVar45._0_8_ = uVar151;
            auVar106._8_8_ = 0;
            auVar106._0_8_ = local_80.n[2];
            uVar146 = auVar135._0_8_ & 0xfffffffffffff;
            auVar46._8_8_ = 0;
            auVar46._0_8_ = uVar146;
            auVar107._8_8_ = 0;
            auVar107._0_8_ = local_80.n[1];
            uVar152 = uVar152 & 0xfffffffffffff;
            auVar47._8_8_ = 0;
            auVar47._0_8_ = uVar152;
            auVar108._8_8_ = 0;
            auVar108._0_8_ = local_80.n[0];
            auVar48._8_8_ = 0;
            auVar48._0_8_ = uVar149;
            auVar109._8_8_ = 0;
            auVar109._0_8_ = local_80.n[4];
            auVar49._8_8_ = 0;
            auVar49._0_8_ = SUB168(auVar48 * auVar109,0);
            auVar5 = auVar45 * auVar106 + auVar44 * auVar105 + auVar46 * auVar107 +
                     auVar47 * auVar108 + auVar49 * ZEXT816(0x1000003d10);
            auVar50._8_8_ = 0;
            auVar50._0_8_ = uVar150;
            auVar110._8_8_ = 0;
            auVar110._0_8_ = local_80.n[4];
            auVar51._8_8_ = 0;
            auVar51._0_8_ = uVar151;
            auVar111._8_8_ = 0;
            auVar111._0_8_ = local_80.n[3];
            auVar52._8_8_ = 0;
            auVar52._0_8_ = uVar146;
            auVar112._8_8_ = 0;
            auVar112._0_8_ = local_80.n[2];
            auVar53._8_8_ = 0;
            auVar53._0_8_ = uVar152;
            auVar113._8_8_ = 0;
            auVar113._0_8_ = local_80.n[1];
            auVar54._8_8_ = 0;
            auVar54._0_8_ = uVar149;
            auVar114._8_8_ = 0;
            auVar114._0_8_ = local_80.n[0];
            auVar55._8_8_ = 0;
            auVar55._0_8_ = SUB168(auVar48 * auVar109,8);
            auVar3 = auVar55 * ZEXT816(0x1000003d10000) +
                     auVar54 * auVar114 +
                     auVar53 * auVar113 +
                     auVar52 * auVar112 + auVar51 * auVar111 + auVar50 * auVar110 + (auVar5 >> 0x34)
            ;
            auVar56._8_8_ = 0;
            auVar56._0_8_ = uVar150;
            auVar115._8_8_ = 0;
            auVar115._0_8_ = local_80.n[0];
            auVar57._8_8_ = 0;
            auVar57._0_8_ = uVar151;
            auVar116._8_8_ = 0;
            auVar116._0_8_ = local_80.n[4];
            auVar58._8_8_ = 0;
            auVar58._0_8_ = uVar146;
            auVar117._8_8_ = 0;
            auVar117._0_8_ = local_80.n[3];
            auVar59._8_8_ = 0;
            auVar59._0_8_ = uVar152;
            auVar118._8_8_ = 0;
            auVar118._0_8_ = local_80.n[2];
            auVar60._8_8_ = 0;
            auVar60._0_8_ = uVar149;
            auVar119._8_8_ = 0;
            auVar119._0_8_ = local_80.n[1];
            auVar4 = auVar60 * auVar119 +
                     auVar59 * auVar118 + auVar58 * auVar117 + auVar57 * auVar116 + (auVar3 >> 0x34)
            ;
            auVar61._8_8_ = 0;
            auVar61._0_8_ = (auVar4._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar3._6_2_ & 0xf);
            auVar6 = auVar61 * ZEXT816(0x1000003d1) + auVar56 * auVar115;
            uVar145 = auVar6._0_8_;
            uVar148 = auVar6._8_8_;
            auVar142._8_8_ = uVar148 >> 0x34;
            auVar142._0_8_ = uVar148 * 0x1000 | uVar145 >> 0x34;
            auVar62._8_8_ = 0;
            auVar62._0_8_ = uVar150;
            auVar120._8_8_ = 0;
            auVar120._0_8_ = local_80.n[1];
            auVar63._8_8_ = 0;
            auVar63._0_8_ = uVar151;
            auVar121._8_8_ = 0;
            auVar121._0_8_ = local_80.n[0];
            auVar64._8_8_ = 0;
            auVar64._0_8_ = uVar146;
            auVar122._8_8_ = 0;
            auVar122._0_8_ = local_80.n[4];
            auVar65._8_8_ = 0;
            auVar65._0_8_ = uVar152;
            auVar123._8_8_ = 0;
            auVar123._0_8_ = local_80.n[3];
            auVar66._8_8_ = 0;
            auVar66._0_8_ = uVar149;
            auVar124._8_8_ = 0;
            auVar124._0_8_ = local_80.n[2];
            auVar4 = (auVar4 >> 0x34) + auVar66 * auVar124 + auVar65 * auVar123 + auVar64 * auVar122
            ;
            uVar156 = auVar4._0_8_;
            uVar148 = auVar4._8_8_;
            auVar67._8_8_ = 0;
            auVar67._0_8_ = uVar156 & 0xfffffffffffff;
            auVar142 = auVar67 * ZEXT816(0x1000003d10) + auVar62 * auVar120 + auVar63 * auVar121 +
                       auVar142;
            uVar155 = auVar142._0_8_;
            uVar154 = auVar142._8_8_;
            auVar131._8_8_ = uVar148 >> 0x34;
            auVar131._0_8_ = uVar148 * 0x1000 | uVar156 >> 0x34;
            auVar132._8_8_ = uVar154 >> 0x34;
            auVar132._0_8_ = uVar154 * 0x1000 | uVar155 >> 0x34;
            auVar68._8_8_ = 0;
            auVar68._0_8_ = uVar150;
            auVar125._8_8_ = 0;
            auVar125._0_8_ = local_80.n[2];
            auVar69._8_8_ = 0;
            auVar69._0_8_ = uVar151;
            auVar126._8_8_ = 0;
            auVar126._0_8_ = local_80.n[1];
            auVar70._8_8_ = 0;
            auVar70._0_8_ = uVar146;
            auVar127._8_8_ = 0;
            auVar127._0_8_ = local_80.n[0];
            auVar71._8_8_ = 0;
            auVar71._0_8_ = uVar152;
            auVar128._8_8_ = 0;
            auVar128._0_8_ = local_80.n[4];
            auVar72._8_8_ = 0;
            auVar72._0_8_ = uVar149;
            auVar129._8_8_ = 0;
            auVar129._0_8_ = local_80.n[3];
            auVar131 = auVar72 * auVar129 + auVar71 * auVar128 + auVar131;
            auVar73._8_8_ = 0;
            auVar73._0_8_ = auVar131._0_8_;
            auVar132 = auVar73 * ZEXT816(0x1000003d10) +
                       auVar70 * auVar127 + auVar68 * auVar125 + auVar69 * auVar126 + auVar132;
            auVar4 = auVar132 >> 0x34;
            auVar139._8_8_ = 0;
            auVar139._0_8_ = auVar4._0_8_;
            auVar74._8_8_ = 0;
            auVar74._0_8_ = auVar131._8_8_;
            auVar138._8_8_ = auVar4._8_8_;
            auVar138._0_8_ = auVar5._0_8_ & 0xfffffffffffff;
            auVar139 = auVar74 * ZEXT816(0x1000003d10000) + auVar138 + auVar139;
            uVar146 = auVar139._0_8_;
            local_58.n[0] =
                 ((uVar145 & 0xfffffffffffff) - (uVar144 & 0xfffffffffffff)) + 0x3ffffbfffff0c3;
            local_58.n[1] =
                 ((uVar155 & 0xfffffffffffff) - (uVar153 & 0xfffffffffffff)) + 0x3ffffffffffffc;
            local_58.n[2] =
                 ((auVar132._0_8_ & 0xfffffffffffff) - (auVar130._0_8_ & 0xfffffffffffff)) +
                 0x3ffffffffffffc;
            local_58.n[3] =
                 ((uVar146 & 0xfffffffffffff) - (uVar147 & 0xfffffffffffff)) + 0x3ffffffffffffc;
            local_58.n[4] =
                 ((auVar3._0_8_ & 0xffffffffffff) -
                 ((auVar134._8_8_ << 0xc | uVar147 >> 0x34) + (auVar2._0_8_ & 0xffffffffffff))) +
                 0x3fffffffffffc + (auVar139._8_8_ << 0xc | uVar146 >> 0x34);
            iVar143 = secp256k1_fe_impl_normalizes_to_zero(&local_58);
          }
        }
      }
      else {
        if (inputlen != 0x21) {
          return 0;
        }
        bVar1 = *input;
        if ((bVar1 & 0xfe) != 2) {
          return 0;
        }
        secp256k1_fe_impl_set_b32_mod(&local_58,input + 1);
        if (((local_58.n[0] < 0xffffefffffc2f) || (local_58.n[4] != 0xffffffffffff)) ||
           (iVar143 = 0, (local_58.n[2] & local_58.n[3] & local_58.n[1]) != 0xfffffffffffff)) {
          iVar143 = secp256k1_ge_set_xo_var(&local_108,&local_58,(uint)(bVar1 == 3));
        }
      }
      if (iVar143 == 0) {
        return 0;
      }
      secp256k1_pubkey_save(pubkey,&local_108);
      return 1;
    }
    secp256k1_ec_pubkey_parse_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ec_pubkey_parse(const secp256k1_context* ctx, secp256k1_pubkey* pubkey, const unsigned char *input, size_t inputlen) {
    secp256k1_ge Q;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(input != NULL);
    if (!secp256k1_eckey_pubkey_parse(&Q, input, inputlen)) {
        return 0;
    }
    if (!secp256k1_ge_is_in_correct_subgroup(&Q)) {
        return 0;
    }
    secp256k1_pubkey_save(pubkey, &Q);
    secp256k1_ge_clear(&Q);
    return 1;
}